

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_connection.c
# Opt level: O0

void apx_connection_on_require_port_write
               (void *arg,apx_portInstance_tag *port_instance,uint8_t *data,apx_size_t size)

{
  dtl_dv_t *pdVar1;
  long lVar2;
  undefined8 uVar3;
  adt_str_t *value;
  dtl_dv_t *dv;
  char *port_name;
  undefined8 *puStack_30;
  apx_error_t result;
  apx_connection_t *self;
  uint8_t *puStack_20;
  apx_size_t size_local;
  uint8_t *data_local;
  apx_portInstance_tag *port_instance_local;
  void *arg_local;
  
  if ((arg != (void *)0x0) && (port_instance != (apx_portInstance_tag *)0x0)) {
    value = (adt_str_t *)0x0;
    puStack_30 = (undefined8 *)arg;
    self._4_4_ = size;
    puStack_20 = data;
    data_local = (uint8_t *)port_instance;
    port_instance_local = (apx_portInstance_tag *)arg;
    pthread_mutex_lock((pthread_mutex_t *)((long)arg + 0x58));
    port_name._4_4_ = apx_client_read_port_data(*puStack_30,data_local,&value);
    if (port_name._4_4_ == 0) {
      dv = (dtl_dv_t *)apx_portInstance_name(data_local);
      pthread_mutex_unlock((pthread_mutex_t *)(puStack_30 + 0xb));
      if (((value != (adt_str_t *)0x0) && (dv != (dtl_dv_t *)0x0)) &&
         (lVar2 = dtl_json_dumps(value,0), pdVar1 = dv, lVar2 != 0)) {
        uVar3 = adt_str_cstr(lVar2);
        printf("\"%s\": %s\n",pdVar1,uVar3);
        fflush(_stdout);
        adt_str_delete(lVar2);
      }
      if (value != (adt_str_t *)0x0) {
        dtl_dv_dec_ref(value);
      }
    }
    else {
      printf("apx_client_read_port_data failed with error code %d\n",(ulong)port_name._4_4_);
    }
  }
  return;
}

Assistant:

static void apx_connection_on_require_port_write(void* arg, struct apx_portInstance_tag* port_instance, uint8_t const* data, apx_size_t size)
{
   apx_connection_t* self = (apx_connection_t*)arg;
   (void)data;
   (void)size;
   if ( (self != NULL) && (port_instance != NULL) )
   {
      apx_error_t result;
      char const* port_name;
      dtl_dv_t* dv = 0;
      MUTEX_LOCK(self->mutex);
      result = apx_client_read_port_data(self->client, port_instance, &dv);
      if (result != APX_NO_ERROR)
      {
         printf("apx_client_read_port_data failed with error code %d\n", (int)result);
         return;
      }
      port_name = apx_portInstance_name(port_instance);
      MUTEX_UNLOCK(self->mutex);
      if ((dv != 0) && (port_name != 0))
      {
         adt_str_t* value = dtl_json_dumps(dv, 0, false);
         if (value != 0)
         {
            printf("\"%s\": %s\n", port_name, adt_str_cstr(value));
            fflush(stdout);
            adt_str_delete(value);
         }
      }
      if (dv != 0)
      {
         dtl_dec_ref(dv);
      }
   }
}